

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O3

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>::TPZGeoBlend
          (TPZGeoBlend<pzgeom::TPZGeoPoint> *this,void **vtt,TPZGeoBlend<pzgeom::TPZGeoPoint> *cp,
          TPZGeoMesh *destmesh)

{
  int64_t nelem;
  TPZGeoEl *pTVar1;
  long lVar2;
  TPZGeoEl **ppTVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  
  (this->super_TPZGeoPoint).super_TPZNodeRep<1,_pztopology::TPZPoint>.super_TPZPoint.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)vtt[4];
  (this->super_TPZGeoPoint).super_TPZNodeRep<1,_pztopology::TPZPoint>.super_TPZPoint.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)vtt[3];
  (this->super_TPZGeoPoint).super_TPZNodeRep<1,_pztopology::TPZPoint>.super_TPZPoint.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)vtt[2];
  (this->super_TPZGeoPoint).super_TPZNodeRep<1,_pztopology::TPZPoint>.fNodeIndexes[0] =
       (cp->super_TPZGeoPoint).super_TPZNodeRep<1,_pztopology::TPZPoint>.fNodeIndexes[0];
  (this->super_TPZGeoPoint).super_TPZNodeRep<1,_pztopology::TPZPoint>.super_TPZPoint.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)vtt[1];
  (this->super_TPZGeoPoint).super_TPZNodeRep<1,_pztopology::TPZPoint>.super_TPZPoint.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)*vtt;
  this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZGeoElSideIndex_0187bb90;
  this->fNeighbours[0].fSide = -1;
  this->fNeighbours[0].fGeoElIndex = -1;
  TPZTransform<double>::TPZTransform((TPZTransform<double> *)&this->field_0x30);
  nelem = cp->fGeoEl->fIndex;
  bVar5 = true;
  lVar6 = 0;
  while (bVar5) {
    this->fNeighbours[lVar6].fGeoElIndex = cp->fNeighbours[lVar6].fGeoElIndex;
    this->fNeighbours[lVar6].fSide = cp->fNeighbours[lVar6].fSide;
    lVar4 = lVar6 * 0x1a0;
    lVar2 = lVar6 * 0x1a0;
    lVar6 = 1;
    bVar5 = false;
    TPZTransform<double>::operator=
              ((TPZTransform<double> *)(&this->field_0x30 + lVar2),
               (TPZTransform<double> *)((long)cp->fNeighbours + lVar4 + 0x18));
  }
  ppTVar3 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                      (&(destmesh->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,nelem);
  pTVar1 = *ppTVar3;
  this->fGeoEl = pTVar1;
  if (pTVar1 == (TPZGeoEl *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.cpp"
               ,0x1d);
  }
  return;
}

Assistant:

pzgeom::TPZGeoBlend<TGeo>::TPZGeoBlend(const TPZGeoBlend<TGeo> &cp, TPZGeoMesh &destmesh) : TPZRegisterClassId(&TPZGeoBlend<TGeo>::ClassId), TGeo(cp,destmesh)
{
    int64_t gelindex = cp.fGeoEl->Index();
    for (int is = 0; is < 1 + TGeo::NSides - TGeo::NNodes; is++) {
        fNeighbours[is] =  cp.fNeighbours[is];
        fTrans[is] =  cp.fTrans[is];
    }
    fGeoEl = destmesh.Element(gelindex);
    if(!fGeoEl) DebugStop();
}